

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O3

cmServerResponse * __thiscall
cmServerProtocol1::ProcessConfigure
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmake *cm;
  pointer pcVar1;
  cmGlobalGenerator *gg;
  cmState *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  cmFileMonitor *pcVar6;
  Value *pVVar7;
  string *psVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  const_iterator cVar9;
  Value passedArgs;
  string errorMessage;
  string sourceDir;
  string buildDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toWatchList;
  _Any_data local_1b0;
  undefined1 local_1a0 [32];
  _Alloc_hider local_180;
  ValueHolder local_178 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  undefined1 local_d8 [24];
  cmServerResponse local_c0;
  
  local_180._M_p = (pointer)request;
  if (this->m_State == STATE_INACTIVE) {
    local_178[0].string_ = (char *)&local_168;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"This instance is inactive.","");
    cmServerRequest::ReportError
              (__return_storage_ptr__,(cmServerRequest *)local_180._M_p,(string *)local_178);
    if (local_178[0] == &local_168) {
      return __return_storage_ptr__;
    }
    operator_delete(local_178[0].string_,local_168._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
  pcVar6 = cmServer::FileMonitor((this->super_cmServerProtocol).m_Server);
  cmFileMonitor::StopMonitoring(pcVar6);
  local_150._M_allocated_capacity = (size_type)&local_140;
  local_150._8_8_ = 0;
  local_140._M_local_buf[0] = '\0';
  cm = (this->super_cmServerProtocol).m_CMakeInstance._M_t.
       super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
       super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
       super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  GeneratorInformation::SetupGenerator(&this->GeneratorInfo,cm,(string *)&local_150);
  if (local_150._8_8_ != 0) {
    cmServerRequest::ReportError
              (__return_storage_ptr__,(cmServerRequest *)local_180._M_p,(string *)&local_150);
    goto LAB_0014b7ed;
  }
  local_1a0._24_8_ = __return_storage_ptr__;
  local_178[0].string_ = (char *)&local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"unused","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_178;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f0,__l,(allocator_type *)local_1b0._M_pod_data);
  if (local_178[0] != &local_168) {
    operator_delete(local_178[0].string_,local_168._M_allocated_capacity + 1);
  }
  pVVar7 = Json::Value::operator[]
                     ((Value *)(local_180._M_p + 0x40),&kCACHE_ARGUMENTS_KEY_abi_cxx11_);
  Json::Value::Value((Value *)local_178,pVVar7);
  bVar4 = Json::Value::isNull((Value *)local_178);
  if (!bVar4) {
    bVar4 = Json::Value::isString((Value *)local_178);
    if (bVar4) {
      Json::Value::asString_abi_cxx11_((string *)&local_1b0,(Value *)local_178);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0);
      if ((cmServerProtocol1 *)local_1b0._M_unused._0_8_ != (cmServerProtocol1 *)local_1a0) {
LAB_0014b2ef:
        operator_delete(local_1b0._M_unused._M_object,(ulong)(local_1a0._0_8_ + 1));
      }
    }
    else {
      bVar4 = Json::Value::isArray((Value *)local_178);
      if (bVar4) {
        cVar9 = Json::Value::begin((Value *)local_178);
        local_130._M_allocated_capacity = (size_type)cVar9.super_ValueIteratorBase.current_._M_node;
        local_130._M_local_buf[8] = cVar9.super_ValueIteratorBase.isNull_;
        cVar9 = Json::Value::end((Value *)local_178);
        local_110._M_allocated_capacity = (size_type)cVar9.super_ValueIteratorBase.current_._M_node;
        local_110._M_local_buf[8] = cVar9.super_ValueIteratorBase.isNull_;
        while (bVar4 = Json::ValueIteratorBase::isEqual
                                 ((ValueIteratorBase *)&local_130,(SelfType *)&local_110), !bVar4) {
          pVVar7 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&local_130);
          bVar4 = Json::Value::isString(pVVar7);
          if (!bVar4) goto LAB_0014b23a;
          Json::Value::asString_abi_cxx11_((string *)&local_1b0,pVVar7);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0
                    );
          if ((cmServerProtocol1 *)local_1b0._M_unused._0_8_ != (cmServerProtocol1 *)local_1a0) {
            operator_delete(local_1b0._M_unused._M_object,(ulong)(local_1a0._0_8_ + 1));
          }
          Json::ValueIteratorBase::increment((ValueIteratorBase *)&local_130);
        }
      }
      else {
LAB_0014b23a:
        local_1b0._M_unused._M_object = (cmServerProtocol1 *)local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b0,
                   "cacheArguments must be unset, a string or an array of strings.","");
        cmServerRequest::ReportError
                  (&local_c0,(cmServerRequest *)local_180._M_p,(string *)&local_1b0);
        Json::Value::~Value(&local_c0.m_Data);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.m_ErrorMessage._M_dataplus._M_p != &local_c0.m_ErrorMessage.field_2) {
          operator_delete(local_c0.m_ErrorMessage._M_dataplus._M_p,
                          local_c0.m_ErrorMessage.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.Cookie._M_dataplus._M_p != &local_c0.Cookie.field_2) {
          operator_delete(local_c0.Cookie._M_dataplus._M_p,
                          local_c0.Cookie.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.Type._M_dataplus._M_p != &local_c0.Type.field_2) {
          operator_delete(local_c0.Type._M_dataplus._M_p,
                          local_c0.Type.field_2._M_allocated_capacity + 1);
        }
        if ((cmServerProtocol1 *)local_1b0._M_unused._0_8_ != (cmServerProtocol1 *)local_1a0)
        goto LAB_0014b2ef;
      }
    }
  }
  psVar8 = cmake::GetHomeDirectory_abi_cxx11_(cm);
  local_130._M_allocated_capacity = (size_type)&local_120;
  pcVar1 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar1,pcVar1 + psVar8->_M_string_length);
  psVar8 = cmake::GetHomeOutputDirectory_abi_cxx11_(cm);
  local_110._M_allocated_capacity = (size_type)&local_100;
  pcVar1 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar1,pcVar1 + psVar8->_M_string_length);
  if (CONCAT71(local_110._9_7_,local_110._M_local_buf[8]) == 0) {
    local_1b0._M_unused._M_object = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"No build directory set via Handshake.","");
    cmServerRequest::ReportError
              ((cmServerResponse *)local_1a0._24_8_,(cmServerRequest *)local_180._M_p,
               (string *)&local_1b0);
LAB_0014b773:
    __return_storage_ptr__ = (cmServerResponse *)local_1a0._24_8_;
    if ((cmServerProtocol1 *)local_1b0._M_unused._0_8_ != (cmServerProtocol1 *)local_1a0) {
      operator_delete(local_1b0._M_unused._M_object,(ulong)(local_1a0._0_8_ + 1));
      __return_storage_ptr__ = (cmServerResponse *)local_1a0._24_8_;
    }
  }
  else {
    gg = cm->GlobalGenerator;
    bVar4 = cmake::LoadCache(cm,(string *)&local_110);
    if (!bVar4) {
      if (CONCAT71(local_130._9_7_,local_130._M_local_buf[8]) != 0) goto LAB_0014b4f9;
      local_1b0._M_unused._M_object = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b0,
                 "No sourceDirectory set via setGlobalSettings and no cache found in buildDirectory."
                 ,"");
      cmServerRequest::ReportError
                ((cmServerResponse *)local_1a0._24_8_,(cmServerRequest *)local_180._M_p,
                 (string *)&local_1b0);
      goto LAB_0014b773;
    }
    pcVar2 = cm->State;
    local_1b0._M_unused._M_object = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"CMAKE_HOME_DIRECTORY","");
    psVar8 = cmState::GetInitializedCacheValue(pcVar2,(string *)&local_1b0);
    if ((undefined1 *)local_1b0._M_unused._0_8_ != local_1a0) {
      operator_delete(local_1b0._M_unused._M_object,(ulong)(local_1a0._0_8_ + 1));
    }
    if (psVar8 != (string *)0x0) {
      if (CONCAT71(local_130._9_7_,local_130._M_local_buf[8]) == 0) {
        std::__cxx11::string::_M_assign((string *)local_130._M_local_buf);
        cmake::SetHomeDirectory(cm,(string *)&local_130);
      }
      pcVar2 = cm->State;
      local_1b0._M_unused._M_object = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"CMAKE_GENERATOR","");
      psVar8 = cmState::GetInitializedCacheValue(pcVar2,(string *)&local_1b0);
      if ((cmServerProtocol1 *)local_1b0._M_unused._0_8_ != (cmServerProtocol1 *)local_1a0) {
        operator_delete(local_1b0._M_unused._M_object,(ulong)(local_1a0._0_8_ + 1));
      }
      if (gg != (cmGlobalGenerator *)0x0 && psVar8 != (string *)0x0) {
        (*gg->_vptr_cmGlobalGenerator[3])(&local_1b0,gg);
        uVar3 = local_1b0._M_unused._0_8_;
        if (local_1b0._8_8_ == psVar8->_M_string_length) {
          if (local_1b0._8_8_ == 0) {
            bVar4 = false;
          }
          else {
            iVar5 = bcmp(local_1b0._M_unused._M_object,(psVar8->_M_dataplus)._M_p,local_1b0._8_8_);
            bVar4 = iVar5 != 0;
          }
        }
        else {
          bVar4 = true;
        }
        if ((cmServerProtocol1 *)uVar3 != (cmServerProtocol1 *)local_1a0) {
          operator_delete((void *)uVar3,(ulong)(local_1a0._0_8_ + 1));
        }
        if (bVar4) {
          local_1b0._M_unused._M_object = local_1a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b0,
                     "Configured generator does not match with CMAKE_GENERATOR found in cache.","");
          __return_storage_ptr__ = (cmServerResponse *)local_1a0._24_8_;
          cmServerRequest::ReportError
                    ((cmServerResponse *)local_1a0._24_8_,(cmServerRequest *)local_180._M_p,
                     (string *)&local_1b0);
          goto LAB_0014b881;
        }
      }
LAB_0014b4f9:
      cmSystemTools::s_FatalErrorOccured = false;
      cmSystemTools::s_ErrorOccured = false;
      iVar5 = cmake::AddCMakePaths(cm);
      if (iVar5 == 1) {
        bVar4 = cmake::SetCacheArgs(cm,&local_f0);
        if (bVar4) {
          iVar5 = cmake::Configure(cm);
          if (-1 < iVar5) {
            local_d8._0_8_ = (pointer)0x0;
            local_d8._8_8_ = 0;
            local_d8._16_8_ = 0;
            local_1b0._8_8_ = 0;
            local_1a0._0_8_ = local_1a0._0_8_ & 0xffffffffffffff00;
            local_1b0._M_unused._M_object = local_1a0;
            cmGetCMakeInputs(gg,(string *)&local_1b0,(string *)&local_110,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)0x0,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_d8,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)0x0);
            if ((undefined1 *)local_1b0._M_unused._0_8_ != local_1a0) {
              operator_delete(local_1b0._M_unused._M_object,local_1a0._0_8_ + 1);
            }
            pcVar6 = cmServer::FileMonitor((this->super_cmServerProtocol).m_Server);
            __return_storage_ptr__ = (cmServerResponse *)local_1a0._24_8_;
            local_1b0._8_8_ = 0;
            local_1a0._8_8_ =
                 std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:612:31)>
                 ::_M_invoke;
            local_1a0._0_8_ =
                 std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:612:31)>
                 ::_M_manager;
            local_1b0._M_unused._M_object = this;
            cmFileMonitor::MonitorPaths
                      (pcVar6,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_d8,(Callback *)&local_1b0);
            if ((_func_int **)local_1a0._0_8_ != (_func_int **)0x0) {
              (*(code *)local_1a0._0_8_)(&local_1b0,&local_1b0,3);
            }
            this->m_State = STATE_CONFIGURED;
            this->m_isDirty = false;
            Json::Value::Value((Value *)&local_1b0,nullValue);
            cmServerRequest::Reply
                      (__return_storage_ptr__,(cmServerRequest *)local_180._M_p,(Value *)&local_1b0)
            ;
            Json::Value::~Value((Value *)&local_1b0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_d8);
            goto LAB_0014b794;
          }
          local_1b0._M_unused._M_object = local_1a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b0,"Configuration failed.","");
          cmServerRequest::ReportError
                    ((cmServerResponse *)local_1a0._24_8_,(cmServerRequest *)local_180._M_p,
                     (string *)&local_1b0);
        }
        else {
          local_1b0._M_unused._M_object = local_1a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b0,"cacheArguments could not be set.","");
          cmServerRequest::ReportError
                    ((cmServerResponse *)local_1a0._24_8_,(cmServerRequest *)local_180._M_p,
                     (string *)&local_1b0);
        }
      }
      else {
        local_1b0._M_unused._M_object = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b0,"Failed to set CMake paths.","");
        cmServerRequest::ReportError
                  ((cmServerResponse *)local_1a0._24_8_,(cmServerRequest *)local_180._M_p,
                   (string *)&local_1b0);
      }
      goto LAB_0014b773;
    }
    local_1b0._M_unused._M_object = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"No CMAKE_HOME_DIRECTORY found in cache.","");
    __return_storage_ptr__ = (cmServerResponse *)local_1a0._24_8_;
    cmServerRequest::ReportError
              ((cmServerResponse *)local_1a0._24_8_,(cmServerRequest *)local_180._M_p,
               (string *)&local_1b0);
LAB_0014b881:
    if ((cmServerProtocol1 *)local_1b0._M_unused._0_8_ != (cmServerProtocol1 *)local_1a0) {
      operator_delete(local_1b0._M_unused._M_object,(ulong)(local_1a0._0_8_ + 1));
    }
  }
LAB_0014b794:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_allocated_capacity != &local_100) {
    operator_delete((void *)local_110._M_allocated_capacity,
                    (ulong)(local_100._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_allocated_capacity != &local_120) {
    operator_delete((void *)local_130._M_allocated_capacity,
                    (ulong)(local_120._M_allocated_capacity + 1));
  }
  Json::Value::~Value((Value *)local_178);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0);
LAB_0014b7ed:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_allocated_capacity != &local_140) {
    operator_delete((void *)local_150._M_allocated_capacity,
                    CONCAT71(local_140._M_allocated_capacity._1_7_,local_140._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessConfigure(
  const cmServerRequest& request)
{
  if (this->m_State == STATE_INACTIVE) {
    return request.ReportError("This instance is inactive.");
  }

  FileMonitor()->StopMonitoring();

  std::string errorMessage;
  cmake* cm = this->CMakeInstance();
  this->GeneratorInfo.SetupGenerator(cm, &errorMessage);
  if (!errorMessage.empty()) {
    return request.ReportError(errorMessage);
  }

  // Make sure the types of cacheArguments matches (if given):
  std::vector<std::string> cacheArgs = { "unused" };
  bool cacheArgumentsError = false;
  const Json::Value passedArgs = request.Data[kCACHE_ARGUMENTS_KEY];
  if (!passedArgs.isNull()) {
    if (passedArgs.isString()) {
      cacheArgs.push_back(passedArgs.asString());
    } else if (passedArgs.isArray()) {
      for (auto const& arg : passedArgs) {
        if (!arg.isString()) {
          cacheArgumentsError = true;
          break;
        }
        cacheArgs.push_back(arg.asString());
      }
    } else {
      cacheArgumentsError = true;
    }
  }
  if (cacheArgumentsError) {
    request.ReportError(
      "cacheArguments must be unset, a string or an array of strings.");
  }

  std::string sourceDir = cm->GetHomeDirectory();
  const std::string buildDir = cm->GetHomeOutputDirectory();

  cmGlobalGenerator* gg = cm->GetGlobalGenerator();

  if (buildDir.empty()) {
    return request.ReportError("No build directory set via Handshake.");
  }

  if (cm->LoadCache(buildDir)) {
    // build directory has been set up before
    const std::string* cachedSourceDir =
      cm->GetState()->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY");
    if (!cachedSourceDir) {
      return request.ReportError("No CMAKE_HOME_DIRECTORY found in cache.");
    }
    if (sourceDir.empty()) {
      sourceDir = *cachedSourceDir;
      cm->SetHomeDirectory(sourceDir);
    }

    const std::string* cachedGenerator =
      cm->GetState()->GetInitializedCacheValue("CMAKE_GENERATOR");
    if (cachedGenerator) {
      if (gg && gg->GetName() != *cachedGenerator) {
        return request.ReportError("Configured generator does not match with "
                                   "CMAKE_GENERATOR found in cache.");
      }
    }
  } else {
    // build directory has not been set up before
    if (sourceDir.empty()) {
      return request.ReportError("No sourceDirectory set via "
                                 "setGlobalSettings and no cache found in "
                                 "buildDirectory.");
    }
  }

  cmSystemTools::ResetErrorOccuredFlag(); // Reset error state

  if (cm->AddCMakePaths() != 1) {
    return request.ReportError("Failed to set CMake paths.");
  }

  if (!cm->SetCacheArgs(cacheArgs)) {
    return request.ReportError("cacheArguments could not be set.");
  }

  int ret = cm->Configure();
  if (ret < 0) {
    return request.ReportError("Configuration failed.");
  }

  std::vector<std::string> toWatchList;
  cmGetCMakeInputs(gg, std::string(), buildDir, nullptr, &toWatchList,
                   nullptr);

  FileMonitor()->MonitorPaths(toWatchList,
                              [this](const std::string& p, int e, int s) {
                                this->HandleCMakeFileChanges(p, e, s);
                              });

  m_State = STATE_CONFIGURED;
  m_isDirty = false;
  return request.Reply(Json::Value());
}